

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdNegatePrivkey(void *handle,char *privkey,char **output)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  undefined8 *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  Privkey key;
  KeyApi api;
  string *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffed0;
  bool *in_stack_fffffffffffffee0;
  NetType *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  allocator local_f1;
  string local_f0 [32];
  Privkey local_d0;
  KeyApi local_ab;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_20 == (undefined8 *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x65e;
    local_48.funcname = "CfdNegatePrivkey";
    cfd::core::logger::warn<>(&local_48,"output is null.");
    local_6a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Failed to parameter. output is null.",&local_69);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe90,error_code,in_stack_fffffffffffffe80);
    local_6a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    cfd::api::KeyApi::KeyApi(&local_ab);
    paVar4 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,local_18,paVar4);
    cfd::api::KeyApi::GetPrivkey
              ((KeyApi *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    cfd::core::Privkey::CreateNegate((Privkey *)&stack0xfffffffffffffec8,&local_d0);
    cfd::core::Privkey::GetHex_abi_cxx11_
              ((string *)&stack0xfffffffffffffee8,(Privkey *)&stack0xfffffffffffffec8);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffed0);
    *local_20 = pcVar3;
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    cfd::core::Privkey::~Privkey((Privkey *)0x5dbe03);
    local_4 = 0;
    cfd::core::Privkey::~Privkey((Privkey *)0x5dbe1b);
    return local_4;
  }
  local_88.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_88.filename = local_88.filename + 1;
  local_88.line = 0x664;
  local_88.funcname = "CfdNegatePrivkey";
  cfd::core::logger::warn<>(&local_88,"privkey is null or empty.");
  local_aa = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Failed to parameter. privkey is null or empty.",&local_a9);
  cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe80);
  local_aa = 0;
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdNegatePrivkey(void* handle, const char* privkey, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    KeyApi api;
    Privkey key = api.GetPrivkey(std::string(privkey), nullptr, nullptr);
    *output = CreateString(key.CreateNegate().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}